

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O2

void __thiscall Arena_ConNoDecon_Test::TestBody(Arena_ConNoDecon_Test *this)

{
  void *ptr;
  ostream *poVar1;
  undefined8 *puVar2;
  char *message;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *in_R9;
  long lVar3;
  bool bVar4;
  AssertHelper AStack_98;
  AssertionResult gtest_ar;
  string local_80;
  AssertionResult gtest_ar_;
  Arena arena;
  
  memt::Arena::Arena(&arena);
  ptr = memt::Arena::alloc(&arena,0x18);
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x18) {
      memt::Arena::freeTop(&arena,ptr);
      std::__cxx11::stringbuf::str();
      std::ios::clear((int)*(undefined8 *)
                            ((anonymous_namespace)::
                             _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>
                             ::_log_abi_cxx11_ + -0x18) + 0x151ab0);
      message = "";
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"",(allocator<char> *)&AStack_98);
      std::__cxx11::stringbuf::str((string *)&DAT_00151ab8);
      std::__cxx11::string::~string((string *)&local_80);
      (anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>
      ::_count = 0;
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
                ((internal *)&gtest_ar,"ConNoDeconHelper::resetLog()","\"+1+2+3\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,
                 (char (*) [7])"+1+2+3");
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                   ,0xc9,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_80);
        this_00 = &gtest_ar.message_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
        if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        this_00 = &gtest_ar_.message_;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             arena._blocks._block._begin == arena._blocks._block._position &&
             arena._blocks._block._previous == (Block *)0x0;
        if (arena._blocks._block._begin != arena._blocks._block._position ||
            arena._blocks._block._previous != (Block *)0x0) {
          testing::Message::Message((Message *)&gtest_ar);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_80,(internal *)&gtest_ar_,(AssertionResult *)"arena.isEmpty()","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                     ,0xca,local_80._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&AStack_98,(Message *)&gtest_ar);
          testing::internal::AssertHelper::~AssertHelper(&AStack_98);
          std::__cxx11::string::~string((string *)&local_80);
          if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
          }
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_00);
      memt::Arena::~Arena(&arena);
      return;
    }
    (anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::
    _count = (anonymous_namespace)::
             _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::_count + 1;
    bVar4 = (anonymous_namespace)::
            _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::_count == 0;
    *(long *)((long)ptr + lVar3) =
         (anonymous_namespace)::
         _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::_count;
    if (bVar4) break;
    poVar1 = std::operator<<((ostream *)
                             &(anonymous_namespace)::
                              _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>
                              ::_log_abi_cxx11_,'+');
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    lVar3 = lVar3 + 8;
  }
  poVar1 = std::operator<<((ostream *)
                           &(anonymous_namespace)::
                            _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::
                            _log_abi_cxx11_,'T');
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = *(undefined8 *)((long)ptr + lVar3);
  __cxa_throw(puVar2,&unsigned_long::typeinfo,0);
}

Assistant:

TEST(Arena, ConNoDecon) {
  memt::Arena arena;
  arena.freeTop(arena.allocArray<ConNoDeconHelper>(3).first);
  ASSERT_EQ(ConNoDeconHelper::resetLog(), "+1+2+3");
  ASSERT_TRUE(arena.isEmpty());
}